

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCondition.hpp
# Opt level: O2

Status __thiscall
AO::BehaviorTree::Version_1::Details::FunctionCondition<Agent,_short>::decide
          (FunctionCondition<Agent,_short> *this,EntityPtr entity,short args)

{
  Status SVar1;
  
  SVar1 = std::function<AO::BehaviorTree::Version_1::Details::Status_(Agent_*,_short)>::operator()
                    (&this->function,entity,args);
  return SVar1;
}

Assistant:

Status decide(EntityPtr entity, Args... args) override final
					{
						return function(entity, args...);
					}